

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_absolute_jump_with_immediate(m68k_info *info,int opcode,int size,int immediate)

{
  byte bVar1;
  cs_m68k *pcVar2;
  
  pcVar2 = build_init_op(info,opcode,1,size);
  pcVar2->operands[0].type = M68K_OP_IMM;
  pcVar2->operands[0].address_mode = M68K_AM_IMMEDIATE;
  pcVar2->operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)immediate;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  return;
}

Assistant:

static void build_absolute_jump_with_immediate(m68k_info *info, int opcode, int size, int immediate)
{
	cs_m68k_op* op;
	cs_m68k* ext = build_init_op(info, opcode, 1, size);

	op = &ext->operands[0];

	op->type = M68K_OP_IMM;
	op->address_mode = M68K_AM_IMMEDIATE;
	op->imm = immediate;

	set_insn_group(info, M68K_GRP_JUMP);
}